

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O1

void __thiscall
fasttext::ProductQuantizer::kmeans(ProductQuantizer *this,real *x,real *c,int32_t n,int32_t d)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  long lVar4;
  uint8_t *code;
  real *prVar5;
  real *prVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  vector<unsigned_char,_std::allocator<unsigned_char>_> codes;
  vector<int,_std::allocator<int>_> perm;
  allocator_type local_8d;
  uint local_8c;
  long local_88;
  real *local_80;
  size_type local_78;
  int *local_70;
  real *local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  local_78 = (size_type)n;
  local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  local_8c = n;
  local_68 = c;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,local_78,(value_type_conflict1 *)&local_60,&local_8d);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    auVar7 = vpbroadcastq_avx512f();
    auVar7 = vpsrlq_avx512f(auVar7,2);
    auVar8 = vpmovsxbd_avx512f(_DAT_0013f9e0);
    uVar2 = 0;
    auVar9 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar10 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar11 = vpbroadcastd_avx512f(ZEXT416(0x10));
    do {
      auVar12 = vpbroadcastq_avx512f();
      auVar13 = vporq_avx512f(auVar12,auVar9);
      auVar12 = vporq_avx512f(auVar12,auVar10);
      vpcmpuq_avx512f(auVar12,auVar7,2);
      vpcmpuq_avx512f(auVar13,auVar7,2);
      auVar12 = vmovdqu32_avx512f(auVar8);
      *(undefined1 (*) [64])
       (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start + uVar2) = auVar12;
      uVar2 = uVar2 + 0x10;
      auVar8 = vpaddd_avx512f(auVar8,auVar11);
    } while ((((ulong)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish +
                      (-4 - (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start)) >> 2) + 0x10 &
             0xfffffffffffffff0) != uVar2);
  }
  std::
  shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>&>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish,&this->rng);
  local_88 = (long)d;
  if (0 < this->ksub_) {
    local_70 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_80 = (real *)(local_88 * 4);
    lVar4 = 0;
    prVar5 = local_68;
    do {
      prVar6 = local_80;
      memcpy(prVar5,x + local_70[lVar4] * local_88,(size_t)local_80);
      lVar4 = lVar4 + 1;
      prVar5 = (real *)((long)prVar5 + (long)prVar6);
    } while (lVar4 < this->ksub_);
  }
  local_80 = x;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_60,local_78,(allocator_type *)&local_8d);
  prVar5 = local_68;
  if (0 < this->niter_) {
    local_78 = (size_type)local_8c;
    local_88 = local_88 << 2;
    iVar1 = 0;
    do {
      local_70 = (int *)CONCAT44(local_70._4_4_,iVar1);
      if (0 < (int)local_8c) {
        code = (uint8_t *)
               CONCAT44(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_4_);
        sVar3 = local_78;
        prVar6 = local_80;
        do {
          assign_centroid(this,prVar6,prVar5,code,d);
          code = code + 1;
          prVar6 = (real *)((long)prVar6 + local_88);
          sVar3 = sVar3 - 1;
        } while (sVar3 != 0);
      }
      MStep(this,local_80,prVar5,
            (uint8_t *)
            CONCAT44(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                     local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._0_4_),d,local_8c);
      iVar1 = (int)local_70 + 1;
    } while (iVar1 < this->niter_);
  }
  if ((void *)CONCAT44(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                       local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_60.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_60.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ProductQuantizer::kmeans(const real* x, real* c, int32_t n, int32_t d) {
  std::vector<int32_t> perm(n, 0);
  std::iota(perm.begin(), perm.end(), 0);
  std::shuffle(perm.begin(), perm.end(), rng);
  for (auto i = 0; i < ksub_; i++) {
    memcpy(&c[i * d], x + perm[i] * d, d * sizeof(real));
  }
  auto codes = std::vector<uint8_t>(n);
  for (auto i = 0; i < niter_; i++) {
    Estep(x, c, codes.data(), d, n);
    MStep(x, c, codes.data(), d, n);
  }
}